

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O2

bool __thiscall
spvtools::EnumSet<spvtools::Extension>::HasEnumAt
          (EnumSet<spvtools::Extension> *this,size_t bucketIndex,BucketType bucketOffset)

{
  pointer pBVar1;
  
  pBVar1 = (this->buckets_).
           super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->buckets_).
                    super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 4) <= bucketIndex)
  {
    __assert_fail("bucketIndex < buckets_.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/enum_set.h"
                  ,0x1b7,
                  "bool spvtools::EnumSet<spvtools::Extension>::HasEnumAt(size_t, BucketType) const [T = spvtools::Extension]"
                 );
  }
  if (bucketOffset < 0x40) {
    return (pBVar1[bucketIndex].data >> (bucketOffset & 0x3f) & 1) != 0;
  }
  __assert_fail("bucketOffset < kBucketSize",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/enum_set.h"
                ,0x1b8,
                "bool spvtools::EnumSet<spvtools::Extension>::HasEnumAt(size_t, BucketType) const [T = spvtools::Extension]"
               );
}

Assistant:

bool HasEnumAt(size_t bucketIndex, BucketType bucketOffset) const {
    assert(bucketIndex < buckets_.size());
    assert(bucketOffset < kBucketSize);
    return buckets_[bucketIndex].data & (1ULL << bucketOffset);
  }